

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase493::run(TestCase493 *this)

{
  bool bVar1;
  __pid_t _Var2;
  TypeByIndex<0UL,_kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *pTVar3;
  TypeByIndex<1UL,_kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *pTVar4;
  TypeByIndex<2UL,_kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *pTVar5;
  __pid_t local_104;
  int local_100;
  bool local_f9;
  undefined1 local_f8 [7];
  bool _kj_shouldLog_2;
  bool local_d9;
  undefined1 local_d8 [7];
  bool _kj_shouldLog_1;
  __pid_t local_bc;
  int local_b8;
  bool local_b1;
  undefined1 local_b0 [7];
  bool _kj_shouldLog;
  Tuple<Promise<int>,_Promise<String>,_Promise<int>_> split;
  undefined1 local_78 [8];
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase493 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  evalLater<kj::(anonymous_namespace)::TestCase493::run()::__0>
            ((kj *)local_78,
             (Type *)((long)&split.impl.super_TupleElement<2U,_kj::Promise<int>_>.value.
                             super_PromiseBase.node.ptr + 7));
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_>::split
            ((SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> *)local_b0,
             (Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> *)local_78);
  pTVar3 = get<0ul,kj::_::Tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>&>
                     ((Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *)
                      local_b0);
  _Var2 = Promise<int>::wait(pTVar3,local_58);
  if (_Var2 != 0x7b) {
    local_b1 = _::Debug::shouldLog(ERROR);
    while (local_b1 != false) {
      local_b8 = 0x7b;
      pTVar3 = get<0ul,kj::_::Tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>&>
                         ((Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *)
                          local_b0);
      local_bc = Promise<int>::wait(pTVar3,local_58);
      _::Debug::log<char_const(&)[58],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1f7,ERROR,
                 "\"failed: expected \" \"(123) == (get<0>(split).wait(waitScope))\", 123, get<0>(split).wait(waitScope)"
                 ,(char (*) [58])"failed: expected (123) == (get<0>(split).wait(waitScope))",
                 &local_b8,&local_bc);
      local_b1 = false;
    }
  }
  pTVar4 = get<1ul,kj::_::Tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>&>
                     ((Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *)
                      local_b0);
  Promise<kj::String>::wait((Promise<kj::String> *)local_d8,pTVar4);
  bVar1 = kj::operator==("foo",(String *)local_d8);
  String::~String((String *)local_d8);
  if (!bVar1) {
    local_d9 = _::Debug::shouldLog(ERROR);
    while (local_d9 != false) {
      pTVar4 = get<1ul,kj::_::Tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>&>
                         ((Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *)
                          local_b0);
      Promise<kj::String>::wait((Promise<kj::String> *)local_f8,pTVar4);
      _::Debug::log<char_const(&)[60],char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1f8,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (get<1>(split).wait(waitScope))\", \"foo\", get<1>(split).wait(waitScope)"
                 ,(char (*) [60])"failed: expected (\"foo\") == (get<1>(split).wait(waitScope))",
                 (char (*) [4])0x654402,(String *)local_f8);
      String::~String((String *)local_f8);
      local_d9 = false;
    }
  }
  pTVar5 = get<2ul,kj::_::Tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>&>
                     ((Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *)
                      local_b0);
  _Var2 = Promise<int>::wait(pTVar5,local_58);
  if (_Var2 != 0x141) {
    local_f9 = _::Debug::shouldLog(ERROR);
    while (local_f9 != false) {
      local_100 = 0x141;
      pTVar5 = get<2ul,kj::_::Tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>&>
                         ((Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *)
                          local_b0);
      local_104 = Promise<int>::wait(pTVar5,local_58);
      _::Debug::log<char_const(&)[58],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1f9,ERROR,
                 "\"failed: expected \" \"(321) == (get<2>(split).wait(waitScope))\", 321, get<2>(split).wait(waitScope)"
                 ,(char (*) [58])"failed: expected (321) == (get<2>(split).wait(waitScope))",
                 &local_100,&local_104);
      local_f9 = false;
    }
  }
  _::Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_>::~Tuple
            ((Tuple<kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_> *)local_b0);
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_>::~Promise
            ((Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, Split) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Tuple<int, String, Promise<int>>> promise = evalLater([&]() {
    return kj::tuple(123, str("foo"), Promise<int>(321));
  });

  Tuple<Promise<int>, Promise<String>, Promise<int>> split = promise.split();

  EXPECT_EQ(123, get<0>(split).wait(waitScope));
  EXPECT_EQ("foo", get<1>(split).wait(waitScope));
  EXPECT_EQ(321, get<2>(split).wait(waitScope));
}